

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

bool __thiscall tinyxml2::XMLUnknown::ShallowEqual(XMLUnknown *this,XMLNode *compare)

{
  int iVar1;
  undefined4 extraout_var;
  char *p;
  char *q;
  bool local_21;
  XMLUnknown *unknown;
  XMLNode *compare_local;
  XMLUnknown *this_local;
  
  iVar1 = (*compare->_vptr_XMLNode[0xb])();
  local_21 = false;
  if ((XMLNode *)CONCAT44(extraout_var,iVar1) != (XMLNode *)0x0) {
    p = XMLNode::Value((XMLNode *)CONCAT44(extraout_var,iVar1));
    q = XMLNode::Value(&this->super_XMLNode);
    local_21 = XMLUtil::StringEqual(p,q,0x7fffffff);
  }
  return local_21;
}

Assistant:

bool XMLUnknown::ShallowEqual( const XMLNode* compare ) const
{
    TIXMLASSERT( compare );
    const XMLUnknown* unknown = compare->ToUnknown();
    return ( unknown && XMLUtil::StringEqual( unknown->Value(), Value() ));
}